

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modkey.c
# Opt level: O0

int ffikyg(fitsfile *fptr,char *keyname,double value,int decim,char *comm,int *status)

{
  int *in_R8;
  char card [81];
  char valstring [71];
  int *in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff34;
  double in_stack_ffffffffffffff38;
  undefined4 local_4;
  
  if (*in_R8 < 1) {
    ffd2f(in_stack_ffffffffffffff38,in_stack_ffffffffffffff34,in_stack_ffffffffffffff28,
          in_stack_ffffffffffffff20);
    ffmkky((char *)card._56_8_,(char *)card._48_8_,(char *)card._40_8_,(char *)card._32_8_,
           (int *)card._24_8_);
    ffikey((fitsfile *)card._24_8_,(char *)card._16_8_,(int *)card._8_8_);
    local_4 = *in_R8;
  }
  else {
    local_4 = *in_R8;
  }
  return local_4;
}

Assistant:

int ffikyg(fitsfile *fptr,          /* I - FITS file pointer  */
           const char *keyname,     /* I - keyword name       */
           double value,            /* I - keyword value      */
           int decim,               /* I - no of decimals     */
           const char *comm,        /* I - keyword comment    */ 
           int *status)             /* IO - error status      */
{
    char valstring[FLEN_VALUE];
    char card[FLEN_CARD];

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    ffd2f(value, decim, valstring, status);   /* convert to formatted string */
    ffmkky(keyname, valstring, comm, card, status);  /* construct the keyword*/
    ffikey(fptr, card, status);  /* write the keyword*/

    return(*status);
}